

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::EntityDestinationRecord(EntityDestinationRecord *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityDestinationRecord_00233a40;
  EntityIdentifier::EntityIdentifier(&this->m_Entity);
  this->m_ui8LnStCmd = '\0';
  this->m_uiPadding1 = '\0';
  this->m_ui16DstCommsDvcID = 0;
  this->m_ui8DstLineID = '\0';
  this->m_ui8DstPriority = '\0';
  return;
}

Assistant:

EntityDestinationRecord::EntityDestinationRecord() :
    m_ui16DstCommsDvcID( 0 ),
    m_ui8DstLineID( 0 ),
    m_ui8DstPriority( 0 ),
    m_ui8LnStCmd( 0 ),
    m_uiPadding1( 0 )
{
}